

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

bool __thiscall Table::in_delimiter(Table *this,char *ch)

{
  bool bVar1;
  undefined1 local_38 [8];
  string s;
  char *ch_local;
  Table *this_local;
  
  s.field_2._8_8_ = ch;
  std::__cxx11::string::string((string *)local_38);
  std::__cxx11::string::push_back((char)(string *)local_38);
  bVar1 = in_delimiter(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool Table::in_delimiter(const char &ch) {
    std::string s;
    s.push_back(ch);
    return in_delimiter(s);
}